

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O1

response_ptr __thiscall
lsp::LanguageService::request_treeView_getNearestShortname
          (LanguageService *this,Id *id,Parameter *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  response_ptr rVar4;
  json result;
  json paramsjson;
  TextDocumentPositionParams lspParams;
  json result_1;
  undefined1 local_e1;
  undefined1 local_e0 [8];
  json_value local_d8;
  undefined1 local_d0 [16];
  TextDocumentPositionParams local_c0;
  ShortnameTreeElement local_98;
  
  (*(params->super_NullableEntity).super_Entity._vptr_Entity[3])(local_d0,params);
  paVar1 = &local_c0.textDocument.uri.field_2;
  local_c0.textDocument.uri._M_string_length = 0;
  local_c0.textDocument.uri.field_2._M_local_buf[0] = '\0';
  local_c0.textDocument.uri._M_dataplus._M_p = (pointer)paVar1;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_d0,"position");
  types::from_json(pvVar3,(Position *)local_e0);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_d0,"uri");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_98.name,pvVar3);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
  paVar2 = &local_98.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  XmlParser::getNearestShortname
            (&local_98,
             xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_c0);
  local_e0[0] = null;
  local_d8.object = (object_t *)0x0;
  types::non_standard::to_json((json *)local_e0,&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.uri._M_dataplus._M_p != &local_98.uri.field_2) {
    operator_delete(local_98.uri._M_dataplus._M_p,local_98.uri.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.path._M_dataplus._M_p != &local_98.path.field_2) {
    operator_delete(local_98.path._M_dataplus._M_p,local_98.path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<jsonrpcpp::Response,std::allocator<jsonrpcpp::Response>,jsonrpcpp::Id_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Response **)this,
             (allocator<jsonrpcpp::Response> *)&local_e1,id,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_e0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_e0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_e0 + 8),local_e0[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.textDocument.uri._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.textDocument.uri._M_dataplus._M_p,
                    CONCAT71(local_c0.textDocument.uri.field_2._M_allocated_capacity._1_7_,
                             local_c0.textDocument.uri.field_2._M_local_buf[0]) + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_d0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_d0 + 8),(value_t)local_d0[0]);
  rVar4.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  rVar4.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (response_ptr)rVar4.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

jsonrpcpp::response_ptr lsp::LanguageService::request_treeView_getNearestShortname(const jsonrpcpp::Id &id, const jsonrpcpp::Parameter &params)
{
    try
    {
        json paramsjson = params.to_json();
        lsp::types::TextDocumentPositionParams lspParams;
        lspParams.position = paramsjson["position"].get<lsp::types::Position>();
        lspParams.textDocument.uri =paramsjson["uri"].get<std::string>();
        json result = xmlParser_->getNearestShortname(lspParams);
        return std::make_shared<jsonrpcpp::Response>(id, result);
    }
    catch(lsp::badUriException &e)
    {
        json result = nullptr;
        return std::make_shared<jsonrpcpp::Response>(id, result);
    }
    catch(lsp::elementNotFoundException &e)
    {
        json result = nullptr;
        return std::make_shared<jsonrpcpp::Response>(id, result);
    }

}